

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O3

WebPMuxError MuxDeleteAllNamedData(WebPMux *mux,uint32_t tag)

{
  WebPChunkId id;
  WebPMuxError WVar1;
  WebPChunk **ppWVar2;
  WebPChunk *pWVar3;
  WebPChunk *chunk;
  
  id = ChunkGetIdFromTag(tag);
  if ((WEBP_CHUNK_IMAGE < id) ||
     (WVar1 = WEBP_MUX_INVALID_ARGUMENT, (0x68U >> (id & 0x1f) & 1) == 0)) {
    ppWVar2 = MuxGetChunkListFromId(mux,id);
    if (*ppWVar2 == (WebPChunk *)0x0) {
      WVar1 = WEBP_MUX_NOT_FOUND;
    }
    else {
      WVar1 = WEBP_MUX_NOT_FOUND;
      chunk = *ppWVar2;
      do {
        if (chunk->tag_ == tag) {
          pWVar3 = ChunkDelete(chunk);
          *ppWVar2 = pWVar3;
          WVar1 = WEBP_MUX_OK;
        }
        else {
          pWVar3 = chunk->next_;
          ppWVar2 = &chunk->next_;
        }
        chunk = pWVar3;
      } while (pWVar3 != (WebPChunk *)0x0);
    }
  }
  return WVar1;
}

Assistant:

static WebPMuxError MuxDeleteAllNamedData(WebPMux* const mux, uint32_t tag) {
  const WebPChunkId id = ChunkGetIdFromTag(tag);
  assert(mux != NULL);
  if (IsWPI(id)) return WEBP_MUX_INVALID_ARGUMENT;
  return DeleteChunks(MuxGetChunkListFromId(mux, id), tag);
}